

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O0

Ptr __thiscall core::image::desaturate<float>(image *this,ConstPtr *img,DesaturateType type)

{
  bool bVar1;
  int iVar2;
  int height;
  ImageBase *pIVar3;
  invalid_argument *piVar4;
  TypedImageBase<float> *pTVar5;
  element_type *peVar6;
  float *pfVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  float fVar10;
  Ptr PVar11;
  float *v;
  int i;
  int pixels;
  int inpos;
  int outpos;
  DesaturateFunc func;
  bool has_alpha;
  int ic;
  DesaturateType type_local;
  ConstPtr *img_local;
  Ptr *out;
  
  bVar1 = std::operator==(img,(nullptr_t)0x0);
  if (bVar1) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Null image given");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pIVar3 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)img);
  iVar2 = ImageBase::channels(pIVar3);
  if ((iVar2 != 3) && (iVar2 != 4)) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Image must be RGB or RGBA");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = iVar2 == 4;
  Image<float>::create();
  pTVar5 = &std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this)->super_TypedImageBase<float>;
  pIVar3 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)img);
  iVar2 = ImageBase::width(pIVar3);
  pIVar3 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)img);
  height = ImageBase::height(pIVar3);
  TypedImageBase<float>::allocate(pTVar5,iVar2,height,bVar1 + 1);
  switch(type) {
  case DESATURATE_MAXIMUM:
    _inpos = desaturate_maximum<float>;
    break;
  case DESATURATE_LIGHTNESS:
    _inpos = desaturate_lightness<float>;
    break;
  case DESATURATE_LUMINOSITY:
    _inpos = desaturate_luminosity<float>;
    break;
  case DESATURATE_LUMINANCE:
    _inpos = desaturate_luminance<float>;
    break;
  case DESATURATE_AVERAGE:
    _inpos = desaturate_average<float>;
    break;
  default:
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Invalid desaturate type");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pixels = 0;
  i = 0;
  pTVar5 = &std::
            __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)img)->super_TypedImageBase<float>;
  iVar2 = TypedImageBase<float>::get_pixel_amount(pTVar5);
  _Var9._M_pi = extraout_RDX;
  for (v._0_4_ = 0; (int)v < iVar2; v._0_4_ = (int)v + 1) {
    peVar6 = std::
             __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)img);
    pfVar7 = Image<float>::at(peVar6,i);
    fVar10 = (float)(*_inpos)(pfVar7);
    peVar8 = std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    pfVar7 = Image<float>::at(peVar8,pixels);
    *pfVar7 = fVar10;
    _Var9._M_pi = extraout_RDX_00;
    if (bVar1) {
      peVar6 = std::
               __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)img);
      pfVar7 = Image<float>::at(peVar6,i + 3);
      fVar10 = *pfVar7;
      peVar8 = std::
               __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      pfVar7 = Image<float>::at(peVar8,pixels + 1);
      *pfVar7 = fVar10;
      _Var9._M_pi = extraout_RDX_01;
    }
    pixels = bVar1 + 1 + pixels;
    i = bVar1 + 3 + i;
  }
  PVar11.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  PVar11.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar11.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

typename Image<T>::Ptr
desaturate (typename Image<T>::ConstPtr img, DesaturateType type)
{
    if (img == nullptr)
        throw std::invalid_argument("Null image given");

    int ic = img->channels();
    if (ic != 3 && ic != 4)
        throw std::invalid_argument("Image must be RGB or RGBA");

    bool has_alpha = (ic == 4);

    typename Image<T>::Ptr out(Image<T>::create());
    out->allocate(img->width(), img->height(), 1 + has_alpha);

    typedef T(*DesaturateFunc)(T const*);
    DesaturateFunc func;
    switch (type)
    {
        case DESATURATE_MAXIMUM: func = desaturate_maximum<T>; break;
        case DESATURATE_LIGHTNESS: func = desaturate_lightness<T>; break;
        case DESATURATE_LUMINOSITY: func = desaturate_luminosity<T>; break;
        case DESATURATE_LUMINANCE: func = desaturate_luminance<T>; break;
        case DESATURATE_AVERAGE: func = desaturate_average<T>; break;
        default: throw std::invalid_argument("Invalid desaturate type");
    }

    int outpos = 0;
    int inpos = 0;
    int pixels = img->get_pixel_amount();
    for (int i = 0; i < pixels; ++i)
    {
        T const* v = &img->at(inpos);
        out->at(outpos) = func(v);

        if (has_alpha)
            out->at(outpos + 1) = img->at(inpos + 3);

        outpos += 1 + has_alpha;
        inpos += 3 + has_alpha;
    }

    return out;
}